

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O3

uint32_t getHostID(ILcidPosixMap *this_0,char *posixID,UErrorCode *status)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  ILcidPosixElement *pIVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  sVar3 = strlen(posixID);
  uVar6 = 0;
  if ((ulong)this_0->numRegions == 0) {
    lVar4 = 0;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    do {
      uVar10 = 0;
      pcVar1 = this_0->regionMaps[uVar7].posixID;
      if ((*posixID != '\0') && (*posixID == *pcVar1)) {
        uVar11 = 0;
        do {
          lVar4 = uVar11 + 1;
          uVar10 = uVar11 + 1;
          if (posixID[lVar4] == '\0') break;
          lVar2 = uVar11 + 1;
          uVar11 = uVar10;
        } while (posixID[lVar4] == pcVar1[lVar2]);
      }
      uVar9 = (uint)uVar10;
      if (((int)uVar8 < (int)uVar9) && (pcVar1[uVar10 & 0xffffffff] == '\0')) {
        uVar6 = uVar7 & 0xffffffff;
        uVar8 = uVar9;
        if (uVar9 == (uint)sVar3) {
          pIVar5 = this_0->regionMaps + uVar7;
          goto LAB_0031469e;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != this_0->numRegions);
    lVar4 = (long)(int)uVar6;
    uVar6 = (ulong)uVar8;
  }
  if ((posixID[uVar6] == '@') || (posixID[uVar6] == '_')) {
    pIVar5 = this_0->regionMaps;
    if (pIVar5[lVar4].posixID[uVar6] == '\0') {
      *status = U_ERROR_WARNING_START;
      pIVar5 = pIVar5 + lVar4;
      goto LAB_0031469e;
    }
  }
  else {
    pIVar5 = this_0->regionMaps;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_0031469e:
  return pIVar5->hostID;
}

Assistant:

static uint32_t
getHostID(const ILcidPosixMap *this_0, const char* posixID, UErrorCode* status)
{
    int32_t bestIdx = 0;
    int32_t bestIdxDiff = 0;
    int32_t posixIDlen = (int32_t)uprv_strlen(posixID);
    uint32_t idx;

    for (idx = 0; idx < this_0->numRegions; idx++ ) {
        int32_t sameChars = idCmp(posixID, this_0->regionMaps[idx].posixID);
        if (sameChars > bestIdxDiff && this_0->regionMaps[idx].posixID[sameChars] == 0) {
            if (posixIDlen == sameChars) {
                /* Exact match */
                return this_0->regionMaps[idx].hostID;
            }
            bestIdxDiff = sameChars;
            bestIdx = idx;
        }
    }
    /* We asked for something unusual, like en_ZZ, and we try to return the number for the same language. */
    /* We also have to make sure that sid and si and similar string subsets don't match. */
    if ((posixID[bestIdxDiff] == '_' || posixID[bestIdxDiff] == '@')
        && this_0->regionMaps[bestIdx].posixID[bestIdxDiff] == 0)
    {
        *status = U_USING_FALLBACK_WARNING;
        return this_0->regionMaps[bestIdx].hostID;
    }

    /*no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return this_0->regionMaps->hostID;
}